

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

int read_StreamsInfo(archive_read *a,_7z_stream_info *si)

{
  _7z_coders_info *val;
  byte bVar1;
  void *pvVar2;
  _7z_folder *p_Var3;
  bool bVar4;
  archive_read *a_00;
  uchar uVar5;
  int iVar6;
  uchar *puVar7;
  uint64_t *puVar8;
  uint64_t *puVar9;
  _7z_folder *p_Var10;
  _7z_coder *p_Var11;
  byte *pbVar12;
  uchar *__dest;
  anon_struct_16_2_4d417c8e *paVar13;
  ulong *puVar14;
  uint64_t *puVar15;
  uint32_t *puVar16;
  uint64_t uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  size_t num;
  ulong uVar21;
  uint uVar22;
  size_t sVar23;
  long lVar24;
  uint64_t local_80;
  ulong local_70;
  _7z_digests local_68;
  ulong local_58;
  archive_read *local_50;
  uint64_t local_48;
  ulong local_40;
  void *local_38;
  
  pvVar2 = a->format->data;
  (si->ss).unpackSizes = (uint64_t *)0x0;
  (si->ss).digestsDefined = (uchar *)0x0;
  (si->ci).dataStreamIndex = 0;
  (si->ss).unpack_streams = 0;
  (si->ci).numFolders = 0;
  (si->ci).folders = (_7z_folder *)0x0;
  (si->pi).digest.digests = (uint32_t *)0x0;
  (si->pi).positions = (uint64_t *)0x0;
  (si->pi).sizes = (uint64_t *)0x0;
  (si->pi).digest.defineds = (uchar *)0x0;
  (si->pi).pos = 0;
  (si->pi).numPackStreams = 0;
  (si->ss).digests = (uint32_t *)0x0;
  puVar7 = header_bytes(a,1);
  if (puVar7 == (uchar *)0x0) {
    return -1;
  }
  uVar5 = *puVar7;
  if (uVar5 == '\x06') {
    (si->pi).digest.digests = (uint32_t *)0x0;
    (si->pi).positions = (uint64_t *)0x0;
    (si->pi).sizes = (uint64_t *)0x0;
    (si->pi).digest.defineds = (uchar *)0x0;
    (si->pi).pos = 0;
    (si->pi).numPackStreams = 0;
    iVar6 = parse_7zip_uint64(a,(uint64_t *)si);
    if (iVar6 < 0) {
      return -1;
    }
    puVar15 = &(si->pi).numPackStreams;
    iVar6 = parse_7zip_uint64(a,puVar15);
    if (iVar6 < 0) {
      return -1;
    }
    if (*puVar15 - 0xf4241 < 0xfffffffffff0bdc0) {
      return -1;
    }
    puVar7 = header_bytes(a,1);
    if (puVar7 == (uchar *)0x0) {
      return -1;
    }
    if (*puVar7 != '\0') {
      if (*puVar7 != '\t') {
        return -1;
      }
      sVar23 = (si->pi).numPackStreams;
      local_50 = a;
      puVar8 = (uint64_t *)calloc(sVar23,8);
      (si->pi).sizes = puVar8;
      puVar9 = (uint64_t *)calloc(sVar23,8);
      a = local_50;
      (si->pi).positions = puVar9;
      if (puVar9 == (uint64_t *)0x0 || puVar8 == (uint64_t *)0x0) {
        return -1;
      }
      if (sVar23 != 0) {
        uVar22 = 1;
        uVar19 = 0;
        do {
          iVar6 = parse_7zip_uint64(a,(si->pi).sizes + uVar19);
          if (iVar6 < 0) {
            return -1;
          }
          uVar19 = (ulong)uVar22;
          uVar22 = uVar22 + 1;
        } while (uVar19 < *puVar15);
      }
      puVar7 = header_bytes(a,1);
      if (puVar7 == (uchar *)0x0) {
        return -1;
      }
      if (*puVar7 == '\0') {
        sVar23 = (si->pi).numPackStreams;
        puVar7 = (uchar *)calloc(sVar23,1);
        a = local_50;
        (si->pi).digest.defineds = puVar7;
        puVar16 = (uint32_t *)calloc(sVar23,4);
        (si->pi).digest.digests = puVar16;
        if (puVar16 == (uint32_t *)0x0 || puVar7 == (uchar *)0x0) {
          return -1;
        }
      }
      else {
        if (*puVar7 != '\t') {
          return -1;
        }
        iVar6 = read_Digests(a,&(si->pi).digest,(si->pi).numPackStreams);
        if (iVar6 < 0) {
          return -1;
        }
        puVar7 = header_bytes(a,1);
        if (puVar7 == (uchar *)0x0) {
          return -1;
        }
        if (*puVar7 != '\0') {
          return -1;
        }
      }
    }
    puVar8 = (si->pi).positions;
    if (puVar8 == (uint64_t *)0x0) {
      return -1;
    }
    puVar9 = (si->pi).sizes;
    if (puVar9 == (uint64_t *)0x0) {
      return -1;
    }
    if (*puVar15 != 0) {
      uVar19 = (si->pi).pos;
      uVar22 = 1;
      uVar18 = 0;
      do {
        puVar8[uVar18] = uVar19;
        uVar19 = uVar19 + puVar9[uVar18];
        if (*(ulong *)((long)pvVar2 + 0x80) < uVar19) {
          return -1;
        }
        uVar18 = (ulong)uVar22;
        uVar22 = uVar22 + 1;
      } while (uVar18 < *puVar15);
    }
    puVar7 = header_bytes(a,1);
    if (puVar7 == (uchar *)0x0) {
      return -1;
    }
    uVar5 = *puVar7;
  }
  if (uVar5 != '\a') {
LAB_0051dc45:
    if (uVar5 == '\b') {
      uVar19 = (si->ci).numFolders;
      p_Var10 = (si->ci).folders;
      (si->ss).unpack_streams = 0;
      (si->ss).unpackSizes = (uint64_t *)0x0;
      (si->ss).digestsDefined = (uchar *)0x0;
      (si->ss).digests = (uint32_t *)0x0;
      if (uVar19 != 0) {
        puVar15 = &p_Var10->numUnpackStreams;
        uVar18 = 1;
        do {
          *puVar15 = 1;
          puVar15 = puVar15 + 0xd;
          bVar4 = uVar18 < uVar19;
          uVar18 = (ulong)((int)uVar18 + 1);
        } while (bVar4);
      }
      puVar7 = header_bytes(a,1);
      if (puVar7 == (uchar *)0x0) {
        return -1;
      }
      uVar5 = *puVar7;
      uVar18 = uVar19;
      if (uVar5 == '\r') {
        if (uVar19 == 0) {
          uVar18 = 0;
        }
        else {
          uVar18 = 0;
          uVar20 = 0;
          uVar21 = 1;
          do {
            iVar6 = parse_7zip_uint64(a,&p_Var10[uVar20].numUnpackStreams);
            if (iVar6 < 0) {
              return -1;
            }
            uVar20 = p_Var10[uVar20].numUnpackStreams;
            if (1000000 < uVar20) {
              return -1;
            }
            uVar18 = uVar18 + uVar20;
            bVar4 = uVar21 < uVar19;
            uVar20 = uVar21;
            uVar21 = (ulong)((int)uVar21 + 1);
          } while (bVar4);
        }
        puVar7 = header_bytes(a,1);
        if (puVar7 == (uchar *)0x0) {
          return -1;
        }
        uVar5 = *puVar7;
      }
      (si->ss).unpack_streams = uVar18;
      local_50 = a;
      if (uVar18 != 0) {
        puVar15 = (uint64_t *)calloc(uVar18,8);
        (si->ss).unpackSizes = puVar15;
        puVar7 = (uchar *)calloc(uVar18,1);
        (si->ss).digestsDefined = puVar7;
        puVar16 = (uint32_t *)calloc(uVar18,4);
        (si->ss).digests = puVar16;
        if (puVar15 == (uint64_t *)0x0) {
          return -1;
        }
        if (puVar16 == (uint32_t *)0x0 || puVar7 == (uchar *)0x0) {
          return -1;
        }
      }
      if (uVar19 != 0) {
        puVar15 = (si->ss).unpackSizes;
        uVar20 = 0;
        do {
          if (p_Var10[uVar20].numUnpackStreams != 0) {
            local_58 = uVar20;
            if ((uVar5 == '\t') && (p_Var10[uVar20].numUnpackStreams != 1)) {
              lVar24 = 0;
              uVar21 = 2;
              do {
                iVar6 = parse_7zip_uint64(local_50,puVar15);
                if (iVar6 < 0) {
                  return -1;
                }
                lVar24 = lVar24 + *puVar15;
                puVar15 = puVar15 + 1;
                bVar4 = uVar21 < p_Var10[uVar20].numUnpackStreams;
                uVar21 = (ulong)((int)uVar21 + 1);
              } while (bVar4);
            }
            else {
              lVar24 = 0;
            }
            uVar17 = folder_uncompressed_size(p_Var10 + uVar20);
            *puVar15 = uVar17 - lVar24;
            puVar15 = puVar15 + 1;
            uVar20 = local_58;
          }
          uVar20 = (ulong)((int)uVar20 + 1);
        } while (uVar20 < uVar19);
      }
      a_00 = local_50;
      if (uVar5 == '\t') {
        puVar7 = header_bytes(local_50,1);
        if (puVar7 == (uchar *)0x0) {
          return -1;
        }
        uVar5 = *puVar7;
      }
      if (uVar18 != 0) {
        uVar20 = 0;
        do {
          (si->ss).digestsDefined[uVar20] = '\0';
          (si->ss).digests[uVar20] = 0;
          uVar20 = uVar20 + 1;
        } while ((uVar20 & 0xffffffff) < uVar18);
      }
      num = 0;
      if (uVar19 != 0) {
        puVar15 = &p_Var10->numUnpackStreams;
        uVar18 = 1;
        do {
          if ((*puVar15 != 1) || (*(uchar *)(puVar15 + -1) == '\0')) {
            num = (size_t)(uint)((int)num + (int)*puVar15);
          }
          puVar15 = puVar15 + 0xd;
          bVar4 = uVar18 < uVar19;
          uVar18 = (ulong)((int)uVar18 + 1);
        } while (bVar4);
      }
      if (uVar5 == '\n') {
        puVar7 = (si->ss).digestsDefined;
        puVar16 = (si->ss).digests;
        local_68.defineds = (uchar *)0x0;
        local_68.digests = (uint32_t *)0x0;
        iVar6 = read_Digests(a_00,&local_68,num);
        if (iVar6 < 0) {
          free(local_68.defineds);
          free(local_68.digests);
          return -1;
        }
        if (uVar19 != 0) {
          uVar18 = 0;
          lVar24 = 0;
          do {
            if (p_Var10[uVar18].numUnpackStreams != 0) {
              if ((p_Var10[uVar18].numUnpackStreams == 1) &&
                 (p_Var10[uVar18].digest_defined != '\0')) {
                *puVar7 = '\x01';
                puVar7 = puVar7 + 1;
                *puVar16 = p_Var10[uVar18].digest;
                puVar16 = puVar16 + 1;
              }
              else {
                lVar24 = (long)(int)lVar24;
                uVar22 = 1;
                do {
                  *puVar7 = local_68.defineds[lVar24];
                  puVar7 = puVar7 + 1;
                  *puVar16 = local_68.digests[lVar24];
                  puVar16 = puVar16 + 1;
                  lVar24 = lVar24 + 1;
                  uVar20 = (ulong)uVar22;
                  uVar22 = uVar22 + 1;
                } while (uVar20 < p_Var10[uVar18].numUnpackStreams);
              }
            }
            uVar18 = uVar18 + 1;
          } while ((uVar18 & 0xffffffff) < uVar19);
        }
        free(local_68.defineds);
        free(local_68.digests);
        puVar7 = header_bytes(a_00,1);
        if (puVar7 == (uchar *)0x0) {
          return -1;
        }
        uVar5 = *puVar7;
      }
      if (uVar5 != '\0') {
        return -1;
      }
      puVar7 = header_bytes(a_00,1);
      if (puVar7 == (uchar *)0x0) {
        return -1;
      }
      uVar5 = *puVar7;
    }
    return -(uint)(uVar5 != '\0');
  }
  (si->ci).numFolders = 0;
  (si->ci).folders = (_7z_folder *)0x0;
  (si->ci).dataStreamIndex = 0;
  local_68.defineds = (uchar *)0x0;
  local_68.digests = (uint32_t *)0x0;
  puVar7 = header_bytes(a,1);
  if ((puVar7 != (uchar *)0x0) && (*puVar7 == '\v')) {
    val = &si->ci;
    iVar6 = parse_7zip_uint64(a,&val->numFolders);
    if (-1 < iVar6) {
      if (1000000 < val->numFolders) {
        return -1;
      }
      puVar7 = header_bytes(a,1);
      if (puVar7 != (uchar *)0x0) {
        if (*puVar7 == '\x01') {
          puVar15 = &(si->ci).dataStreamIndex;
          iVar6 = parse_7zip_uint64(a,puVar15);
          if (iVar6 < 0) {
            return -1;
          }
          if (1000000 < *puVar15) {
            return -1;
          }
        }
        else if (*puVar7 == '\0') {
          sVar23 = (si->ci).numFolders;
          p_Var10 = (_7z_folder *)calloc(sVar23,0x68);
          (si->ci).folders = p_Var10;
          if (p_Var10 == (_7z_folder *)0x0) {
            return -1;
          }
          if (sVar23 != 0) {
            uVar19 = 0;
            do {
              p_Var3 = (si->ci).folders;
              p_Var10 = p_Var3 + uVar19;
              local_38 = a->format->data;
              p_Var3[uVar19].numUnpackStreams = 0;
              (&p_Var3[uVar19].numUnpackStreams)[1] = 0;
              p_Var3[uVar19].unPackSize = (uint64_t *)0x0;
              (&p_Var3[uVar19].unPackSize)[1] = (uint64_t *)0x0;
              p_Var3[uVar19].numInStreams = 0;
              (&p_Var3[uVar19].numInStreams)[1] = 0;
              p_Var3[uVar19].numPackedStreams = 0;
              (&p_Var3[uVar19].numPackedStreams)[1] = 0;
              p_Var3[uVar19].numBindPairs = 0;
              (&p_Var3[uVar19].numBindPairs)[1] = 0;
              p_Var3[uVar19].numCoders = 0;
              p_Var3[uVar19].coders = (_7z_coder *)0x0;
              p_Var3[uVar19].skipped_bytes = 0;
              local_40 = uVar19;
              iVar6 = parse_7zip_uint64(a,&p_Var10->numCoders);
              if ((iVar6 < 0) || (uVar19 = p_Var10->numCoders, 4 < uVar19)) goto LAB_0051e048;
              p_Var11 = (_7z_coder *)calloc(uVar19,0x28);
              p_Var10->coders = p_Var11;
              if ((uVar19 == 0) || (p_Var11 == (_7z_coder *)0x0)) goto LAB_0051e048;
              local_58 = 0;
              local_70 = 0;
              local_48 = 0;
              do {
                pbVar12 = header_bytes(a,1);
                if ((pbVar12 == (byte *)0x0) || (bVar1 = *pbVar12, (char)bVar1 < '\0'))
                goto LAB_0051e048;
                puVar7 = header_bytes(a,(ulong)(bVar1 & 0xf));
                uVar19 = local_58;
                if (puVar7 == (uchar *)0x0) goto LAB_0051e048;
                if ((bVar1 & 0xf) == 0) {
                  uVar18 = 0;
                }
                else {
                  uVar20 = 0;
                  uVar18 = 0;
                  do {
                    uVar18 = uVar18 << 8 | (ulong)puVar7[uVar20];
                    uVar20 = uVar20 + 1;
                  } while ((bVar1 & 0xf) != uVar20);
                }
                p_Var11 = p_Var10->coders;
                puVar15 = &p_Var11[local_58].numInStreams;
                p_Var11[local_58].codec = uVar18;
                if ((bVar1 & 0x10) == 0) {
                  *puVar15 = 1;
                  p_Var11[local_58].numOutStreams = 1;
                }
                else {
                  iVar6 = parse_7zip_uint64(a,puVar15);
                  if ((((iVar6 < 0) || (1000000 < p_Var10->coders[uVar19].numInStreams)) ||
                      (iVar6 = parse_7zip_uint64(a,&p_Var10->coders[uVar19].numOutStreams),
                      iVar6 < 0)) ||
                     (p_Var11 = p_Var10->coders, 1000000 < p_Var11[uVar19].numOutStreams))
                  goto LAB_0051e048;
                }
                if ((bVar1 & 0x20) != 0) {
                  iVar6 = parse_7zip_uint64(a,&p_Var11[uVar19].propertiesSize);
                  if ((iVar6 < 0) ||
                     (puVar7 = header_bytes(a,p_Var10->coders[uVar19].propertiesSize),
                     puVar7 == (uchar *)0x0)) goto LAB_0051e048;
                  p_Var11 = p_Var10->coders;
                  sVar23 = p_Var11[uVar19].propertiesSize;
                  __dest = (uchar *)malloc(sVar23);
                  p_Var11[uVar19].properties = __dest;
                  if (__dest == (uchar *)0x0) goto LAB_0051e048;
                  memcpy(__dest,puVar7,sVar23);
                }
                local_70 = local_70 + p_Var11[uVar19].numInStreams;
                local_48 = local_48 + p_Var11[uVar19].numOutStreams;
                local_58 = (ulong)((int)local_58 + 1);
              } while (local_58 < p_Var10->numCoders);
              if (((local_48 == 0) || (sVar23 = local_48 - 1, local_70 < sVar23)) ||
                 (p_Var10->numBindPairs = sVar23, *(ulong *)((long)local_38 + 0x70) < sVar23))
              goto LAB_0051e048;
              if (sVar23 == 0) {
                p_Var10->bindPairs = (anon_struct_16_2_4d417c8e *)0x0;
                paVar13 = (anon_struct_16_2_4d417c8e *)0x0;
                uVar19 = 0;
              }
              else {
                paVar13 = (anon_struct_16_2_4d417c8e *)calloc(sVar23,0x10);
                p_Var10->bindPairs = paVar13;
                if (paVar13 == (anon_struct_16_2_4d417c8e *)0x0) goto LAB_0051e048;
                uVar18 = 0;
                uVar20 = 1;
                do {
                  iVar6 = parse_7zip_uint64(a,&paVar13[uVar18].inIndex);
                  if ((((iVar6 < 0) || (1000000 < p_Var10->bindPairs[uVar18].inIndex)) ||
                      (iVar6 = parse_7zip_uint64(a,&p_Var10->bindPairs[uVar18].outIndex), iVar6 < 0)
                      ) || (paVar13 = p_Var10->bindPairs, 1000000 < paVar13[uVar18].outIndex))
                  goto LAB_0051e048;
                  uVar19 = p_Var10->numBindPairs;
                  bVar4 = uVar20 < uVar19;
                  uVar18 = uVar20;
                  uVar20 = (ulong)((int)uVar20 + 1);
                } while (bVar4);
              }
              sVar23 = local_70 - uVar19;
              p_Var10->numPackedStreams = sVar23;
              puVar14 = (ulong *)calloc(sVar23,8);
              p_Var10->packedStreams = puVar14;
              if (puVar14 == (ulong *)0x0) goto LAB_0051e048;
              if (sVar23 == 1) {
                if (local_70 == 0) goto LAB_0051e048;
                uVar18 = 0;
                do {
                  if (uVar19 == 0) {
                    uVar20 = 0;
                  }
                  else {
                    uVar22 = 1;
                    uVar20 = 0;
                    do {
                      if (paVar13[uVar20].inIndex == uVar18) break;
                      uVar20 = (ulong)uVar22;
                      uVar22 = uVar22 + 1;
                    } while (uVar20 < uVar19);
                  }
                } while ((uVar19 != uVar20) &&
                        (uVar18 = (ulong)((int)uVar18 + 1), uVar18 < local_70));
                if (local_70 == uVar18) goto LAB_0051e048;
                *puVar14 = uVar18;
              }
              else if (local_70 != uVar19) {
                uVar19 = 1;
                uVar18 = 0;
                do {
                  uVar20 = uVar19;
                  iVar6 = parse_7zip_uint64(a,puVar14 + uVar18);
                  if ((iVar6 < 0) || (puVar14 = p_Var10->packedStreams, 1000000 < puVar14[uVar18]))
                  goto LAB_0051e048;
                  uVar19 = (ulong)((int)uVar20 + 1);
                  uVar18 = uVar20;
                } while (uVar20 < p_Var10->numPackedStreams);
              }
              p_Var10->numInStreams = local_70;
              p_Var10->numOutStreams = local_48;
              uVar19 = (ulong)((int)local_40 + 1);
            } while (uVar19 < val->numFolders);
          }
        }
        puVar7 = header_bytes(a,1);
        if ((puVar7 != (uchar *)0x0) && (*puVar7 == '\f')) {
          local_80 = val->numFolders;
          if (local_80 != 0) {
            uVar19 = 0;
            do {
              p_Var10 = (si->ci).folders;
              sVar23 = p_Var10[uVar19].numOutStreams;
              puVar15 = (uint64_t *)calloc(sVar23,8);
              p_Var10[uVar19].unPackSize = puVar15;
              if (puVar15 == (uint64_t *)0x0) goto LAB_0051e048;
              if (sVar23 != 0) {
                uVar22 = 1;
                uVar18 = 0;
                do {
                  iVar6 = parse_7zip_uint64(a,p_Var10[uVar19].unPackSize + uVar18);
                  if (iVar6 < 0) goto LAB_0051e048;
                  uVar18 = (ulong)uVar22;
                  uVar22 = uVar22 + 1;
                } while (uVar18 < p_Var10[uVar19].numOutStreams);
                local_80 = val->numFolders;
              }
              uVar19 = (ulong)((int)uVar19 + 1);
            } while (uVar19 < local_80);
          }
          puVar7 = header_bytes(a,1);
          if (puVar7 != (uchar *)0x0) {
            if (*puVar7 == '\n') {
              iVar6 = read_Digests(a,&local_68,val->numFolders);
              if (iVar6 < 0) goto LAB_0051e048;
              uVar19 = val->numFolders;
              if (uVar19 != 0) {
                puVar16 = &((si->ci).folders)->digest;
                uVar18 = 0;
                do {
                  *(uchar *)(puVar16 + -1) = local_68.defineds[uVar18];
                  *puVar16 = local_68.digests[uVar18];
                  uVar18 = uVar18 + 1;
                  puVar16 = puVar16 + 0x1a;
                } while ((uVar18 & 0xffffffff) < uVar19);
              }
              puVar7 = header_bytes(a,1);
              if ((puVar7 == (uchar *)0x0) || (*puVar7 != '\0')) goto LAB_0051e048;
              free(local_68.defineds);
              free(local_68.digests);
            }
            else if (*puVar7 != '\0') goto LAB_0051e048;
            uVar19 = (si->ci).numFolders;
            if (uVar19 != 0) {
              p_Var10 = (si->ci).folders;
              uVar18 = (si->pi).numPackStreams;
              uVar21 = 0;
              uVar22 = 1;
              uVar20 = 0;
              do {
                p_Var10[uVar21].packIndex = (uint32_t)uVar20;
                uVar20 = (ulong)((uint32_t)uVar20 + (int)p_Var10[uVar21].numPackedStreams);
                if (uVar18 < uVar20) {
                  return -1;
                }
                uVar21 = (ulong)uVar22;
                uVar22 = uVar22 + 1;
              } while (uVar21 < uVar19);
            }
            puVar7 = header_bytes(a,1);
            if (puVar7 == (uchar *)0x0) {
              return -1;
            }
            uVar5 = *puVar7;
            goto LAB_0051dc45;
          }
        }
      }
    }
  }
LAB_0051e048:
  free(local_68.defineds);
  free(local_68.digests);
  return -1;
}

Assistant:

static int
read_StreamsInfo(struct archive_read *a, struct _7z_stream_info *si)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	unsigned i;

	memset(si, 0, sizeof(*si));

	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == kPackInfo) {
		uint64_t packPos;

		if (read_PackInfo(a, &(si->pi)) < 0)
			return (-1);

		if (si->pi.positions == NULL || si->pi.sizes == NULL)
			return (-1);
		/*
		 * Calculate packed stream positions.
		 */
		packPos = si->pi.pos;
		for (i = 0; i < si->pi.numPackStreams; i++) {
			si->pi.positions[i] = packPos;
			packPos += si->pi.sizes[i];
			if (packPos > zip->header_offset)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}
	if (*p == kUnPackInfo) {
		uint32_t packIndex;
		struct _7z_folder *f;

		if (read_CodersInfo(a, &(si->ci)) < 0)
			return (-1);

		/*
		 * Calculate packed stream indexes.
		 */
		packIndex = 0;
		f = si->ci.folders;
		for (i = 0; i < si->ci.numFolders; i++) {
			f[i].packIndex = packIndex;
			packIndex += (uint32_t)f[i].numPackedStreams;
			if (packIndex > si->pi.numPackStreams)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	if (*p == kSubStreamsInfo) {
		if (read_SubStreamsInfo(a, &(si->ss),
		    si->ci.folders, (size_t)si->ci.numFolders) < 0)
			return (-1);
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	/*
	 *  Must be kEnd.
	 */
	if (*p != kEnd)
		return (-1);
	return (0);
}